

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

string * __thiscall
flatbuffers::python::PythonGenerator::ReturnType_abi_cxx11_
          (string *__return_storage_ptr__,PythonGenerator *this,StructDef *struct_def,
          FieldDef *field)

{
  pointer pcVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  string self_type;
  long *local_80;
  size_t local_78;
  long local_70 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  pcVar1 = (struct_def->super_Definition).name._M_dataplus._M_p;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,
             pcVar1 + (struct_def->super_Definition).name._M_string_length);
  GenTypeGet_abi_cxx11_(__return_storage_ptr__,this,&(field->value).type);
  if (local_78 == __return_storage_ptr__->_M_string_length) {
    if (local_78 != 0) {
      iVar2 = bcmp(local_80,(__return_storage_ptr__->_M_dataplus)._M_p,local_78);
      if (iVar2 != 0) goto LAB_00288bde;
    }
    std::operator+(&local_60,"\'",__return_storage_ptr__);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_60);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_30 = *plVar4;
      lStack_28 = plVar3[3];
      local_40 = &local_30;
    }
    else {
      local_30 = *plVar4;
      local_40 = (long *)*plVar3;
    }
    local_38 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    if (local_40 != &local_30) {
      operator_delete(local_40,local_30 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00288bde:
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ReturnType(const StructDef &struct_def,
                         const FieldDef &field) const {
    // If we have a class member that returns an instance of the same class,
    // for example:
    // class Field(object):
    //   def Children(self, j: int) -> Optional[Field]:
    //     pass
    //
    // we need to quote the return type:
    // class Field(object):
    //   def Children(self, j: int) -> Optional['Field']:
    //     pass
    //
    // because Python is unable to resolve the name during parse and will return
    // an error.
    // (see PEP 484 under forward references:
    // https://peps.python.org/pep-0484/#forward-references)
    const std::string self_type = struct_def.name;
    std::string field_type = TypeName(field);

    if (self_type == field_type) { field_type = "'" + field_type + "'"; }

    return field_type;
  }